

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int param_missing_gost_ec(EVP_PKEY *pk)

{
  EC_KEY *key;
  EC_GROUP *pEVar1;
  EVP_PKEY *in_RDI;
  EC_KEY *ec;
  undefined4 local_4;
  
  key = (EC_KEY *)EVP_PKEY_get0(in_RDI);
  if (key == (EC_KEY *)0x0) {
    local_4 = 1;
  }
  else {
    pEVar1 = EC_KEY_get0_group(key);
    if (pEVar1 == (EC_GROUP *)0x0) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int param_missing_gost_ec(const EVP_PKEY *pk)
{
    const EC_KEY *ec = EVP_PKEY_get0((EVP_PKEY *)pk);
    if (!ec)
        return 1;
    if (!EC_KEY_get0_group(ec))
        return 1;
    return 0;
}